

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

void helics::BrokerFactory::addExtraTypes(string *name,CoreType type)

{
  CoreType type_00;
  
  if ((int)type < 5) {
    if (type == TEST) {
      type_00 = INPROC;
    }
    else {
      if (type != INTERPROCESS) {
        return;
      }
      type_00 = IPC;
    }
  }
  else if (type == IPC) {
    type_00 = INTERPROCESS;
  }
  else {
    type_00 = TEST;
    if (type != INPROC) {
      return;
    }
  }
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
            ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,name,
             type_00);
  return;
}

Assistant:

static void addExtraTypes(const std::string& name, CoreType type)
{
    switch (type) {
        case CoreType::INPROC:
            searchableBrokers.addType(name, CoreType::TEST);
            break;
        case CoreType::TEST:
            searchableBrokers.addType(name, CoreType::INPROC);
            break;
        case CoreType::IPC:
            searchableBrokers.addType(name, CoreType::INTERPROCESS);
            break;
        case CoreType::INTERPROCESS:
            searchableBrokers.addType(name, CoreType::IPC);
            break;
        default:
            break;
    }
}